

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O0

void __thiscall TPZStructMatrix::Write(TPZStructMatrix *this,TPZStream *buf,int withclassid)

{
  TPZCompMesh *obj;
  undefined4 in_EDX;
  TPZStream *in_RSI;
  TPZEquationFilter *in_RDI;
  TPZStream *in_stack_ffffffffffffffb8;
  TPZSavable *in_stack_ffffffffffffffc0;
  int withclassid_00;
  TPZStream *buf_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  TPZPersistenceManager::WritePointer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  obj = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)&in_RDI->fIsActive);
  buf_00 = (TPZStream *)0x0;
  if (obj != (TPZCompMesh *)0x0) {
    buf_00 = (TPZStream *)
             ((long)(obj->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fVec.fExtAlloc +
             *(long *)(*(long *)obj + -0x60) + -0x70);
  }
  TPZPersistenceManager::WritePointer((TPZSavable *)obj,in_stack_ffffffffffffffb8);
  withclassid_00 = (int)((ulong)obj >> 0x20);
  TPZStream::Write<int>
            (in_RSI,(set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  TPZEquationFilter::Write(in_RDI,buf_00,withclassid_00);
  return;
}

Assistant:

void TPZStructMatrix::Write(TPZStream& buf, int withclassid) const {
    //DO NOT WRITE THE TPZMATPARINTERFACE
    TPZPersistenceManager::WritePointer(fMesh, &buf);
    TPZPersistenceManager::WritePointer(fCompMesh.operator ->(), &buf);
    buf.Write(fMaterialIds);
    fEquationFilter.Write(buf,withclassid);
}